

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createCallToUndefinedFunction
          (LLVMReadWriteGraphBuilder *this,Function *function,CallInst *CInst)

{
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  StringRef LHS;
  StringRef LHS_00;
  StringRef LHS_01;
  bool bVar1;
  AllocationFunction AVar2;
  RWNode *pRVar3;
  AnalysisOptions *this_00;
  AllocationFunction extraout_var;
  Function *in_RSI;
  StringRef *in_RDI;
  CallInst *in_stack_00000050;
  AllocationFunction type;
  LLVMReadWriteGraphBuilder *in_stack_00000058;
  CallInst *in_stack_00000070;
  LLVMReadWriteGraphBuilder *in_stack_00000078;
  CallInst *in_stack_ffffffffffffff28;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  CallInst *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  AllocationFunction type_00;
  StringRef *in_stack_ffffffffffffff58;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffff60;
  CallInst *in_stack_ffffffffffffffa8;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffffb0;
  RWNode *local_8;
  
  bVar1 = llvm::Function::isIntrinsic(in_RSI);
  if (bVar1) {
    pRVar3 = createIntrinsicCall(in_stack_00000078,in_stack_00000070);
    return pRVar3;
  }
  if ((in_RDI[0xd].Data[0x98] & 1U) != 0) {
    llvm::Value::getName();
    llvm::StringRef::StringRef
              (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    LHS.Length._0_4_ = in_stack_ffffffffffffff50;
    LHS.Data = (char *)in_stack_ffffffffffffff48;
    LHS.Length._4_4_ = in_stack_ffffffffffffff54;
    RHS.Data._4_4_ = in_stack_ffffffffffffff3c;
    RHS.Data._0_4_ = in_stack_ffffffffffffff38;
    RHS.Length = (size_t)in_RDI;
    bVar1 = llvm::operator==(LHS,RHS);
    if (bVar1) {
      pRVar3 = createPthreadCreateCalls(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      return pRVar3;
    }
    llvm::Value::getName();
    llvm::StringRef::StringRef
              (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    LHS_00.Length._0_4_ = in_stack_ffffffffffffff50;
    LHS_00.Data = (char *)in_stack_ffffffffffffff48;
    LHS_00.Length._4_4_ = in_stack_ffffffffffffff54;
    RHS_00.Data._4_4_ = in_stack_ffffffffffffff3c;
    RHS_00.Data._0_4_ = in_stack_ffffffffffffff38;
    RHS_00.Length = (size_t)in_RDI;
    bVar1 = llvm::operator==(LHS_00,RHS_00);
    if (bVar1) {
      pRVar3 = createPthreadJoinCall
                         ((LLVMReadWriteGraphBuilder *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          in_stack_ffffffffffffff48);
      return pRVar3;
    }
    llvm::Value::getName();
    llvm::StringRef::StringRef
              (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    LHS_01.Length._0_4_ = in_stack_ffffffffffffff50;
    LHS_01.Data = (char *)in_stack_ffffffffffffff48;
    LHS_01.Length._4_4_ = in_stack_ffffffffffffff54;
    RHS_01.Data._4_4_ = in_stack_ffffffffffffff3c;
    RHS_01.Data._0_4_ = in_stack_ffffffffffffff38;
    RHS_01.Length = (size_t)in_RDI;
    bVar1 = llvm::operator==(LHS_01,RHS_01);
    if (bVar1) {
      pRVar3 = createPthreadExitCall(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      return pRVar3;
    }
  }
  this_00 = (AnalysisOptions *)llvm::Value::getName();
  type_00 = extraout_var;
  llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffff58);
  AVar2 = AnalysisOptions::getAllocationFunction(this_00,(string *)in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  if (AVar2 == NONE) {
    local_8 = createUnknownCall(in_stack_00000058,in_stack_00000050);
  }
  else if (AVar2 == REALLOC) {
    local_8 = createRealloc(in_stack_ffffffffffffff60,(Instruction *)in_stack_ffffffffffffff58);
  }
  else {
    local_8 = createDynAlloc(in_stack_ffffffffffffff60,(Instruction *)in_stack_ffffffffffffff58,
                             type_00);
  }
  return local_8;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createCallToUndefinedFunction(
        const llvm::Function *function, const llvm::CallInst *CInst) {
    if (function->isIntrinsic()) {
        return createIntrinsicCall(CInst);
    }
    if (_options.threads) {
        // assert(false && "Threads unsupported yet");
        if (function->getName() == "pthread_create") {
            return createPthreadCreateCalls(CInst);
        } else if (function->getName() == "pthread_join") {
            return createPthreadJoinCall(CInst);
        } else if (function->getName() == "pthread_exit") {
            return createPthreadExitCall(CInst);
        }
    }

    auto type = _options.getAllocationFunction(function->getName().str());
    if (type != AllocationFunction::NONE) {
        if (type == AllocationFunction::REALLOC)
            return createRealloc(CInst);
        return createDynAlloc(CInst, type);
    }
    return createUnknownCall(CInst);

    assert(false && "Unreachable");
    abort();
}